

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

size_t __thiscall google::protobuf::FieldOptions::ByteSizeLong(FieldOptions *this)

{
  uint uVar1;
  size_t sVar2;
  UnknownFieldSet *unknown_fields;
  size_t sVar3;
  Type *value;
  uint i;
  uint index;
  
  sVar2 = internal::ExtensionSet::ByteSize(&this->_extensions_);
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) != 0) {
    unknown_fields = FieldOptions::unknown_fields(this);
    sVar3 = internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
    sVar2 = sVar2 + sVar3;
  }
  uVar1 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
  sVar2 = sVar2 + (ulong)uVar1 * 2;
  for (index = 0; uVar1 != index; index = index + 1) {
    value = internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
                      (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,index);
    sVar3 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::UninterpretedOption>
                      (value);
    sVar2 = sVar2 + sVar3;
  }
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 0x3f) != 0) {
    if ((uVar1 & 1) != 0) {
      sVar3 = io::CodedOutputStream::VarintSize32SignExtended(this->ctype_);
      sVar2 = sVar2 + sVar3 + 1;
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    sVar2 = (ulong)(uVar1 >> 3 & 2) + (ulong)(uVar1 >> 2 & 2) +
            (ulong)(uVar1 >> 1 & 2) + (uVar1 & 2) + sVar2;
    if ((uVar1 & 0x20) != 0) {
      sVar3 = io::CodedOutputStream::VarintSize32SignExtended(this->jstype_);
      sVar2 = sVar2 + sVar3 + 1;
    }
  }
  this->_cached_size_ = (int)sVar2;
  return sVar2;
}

Assistant:

size_t FieldOptions::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.FieldOptions)
  size_t total_size = 0;

  total_size += _extensions_.ByteSize();

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  {
    unsigned int count = this->uninterpreted_option_size();
    total_size += 2UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->uninterpreted_option(i));
    }
  }

  if (_has_bits_[0 / 32] & 63u) {
    // optional .google.protobuf.FieldOptions.CType ctype = 1 [default = STRING];
    if (has_ctype()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::EnumSize(this->ctype());
    }

    // optional bool packed = 2;
    if (has_packed()) {
      total_size += 1 + 1;
    }

    // optional bool lazy = 5 [default = false];
    if (has_lazy()) {
      total_size += 1 + 1;
    }

    // optional bool deprecated = 3 [default = false];
    if (has_deprecated()) {
      total_size += 1 + 1;
    }

    // optional bool weak = 10 [default = false];
    if (has_weak()) {
      total_size += 1 + 1;
    }

    // optional .google.protobuf.FieldOptions.JSType jstype = 6 [default = JS_NORMAL];
    if (has_jstype()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::EnumSize(this->jstype());
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}